

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall google::protobuf::EnumDescriptorProto::IsInitialized(EnumDescriptorProto *this)

{
  int iVar1;
  Type *pTVar2;
  int i;
  int iVar3;
  EnumOptions *pEVar4;
  
  iVar3 = 0;
  while (iVar3 < (this->value_).super_RepeatedPtrFieldBase.current_size_) {
    pTVar2 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                       (&(this->value_).super_RepeatedPtrFieldBase,iVar3);
    iVar1 = (*(pTVar2->super_Message).super_MessageLite._vptr_MessageLite[5])(pTVar2);
    iVar3 = iVar3 + 1;
    if ((char)iVar1 == '\0') {
      return false;
    }
  }
  if ((this->_has_bits_[0] & 4) != 0) {
    pEVar4 = this->options_;
    if (pEVar4 == (EnumOptions *)0x0) {
      pEVar4 = *(EnumOptions **)(default_instance_ + 0x30);
    }
    iVar3 = (*(pEVar4->super_Message).super_MessageLite._vptr_MessageLite[5])();
    if ((char)iVar3 == '\0') {
      return false;
    }
  }
  return true;
}

Assistant:

bool EnumDescriptorProto::IsInitialized() const {

  for (int i = 0; i < value_size(); i++) {
    if (!this->value(i).IsInitialized()) return false;
  }
  if (has_options()) {
    if (!this->options().IsInitialized()) return false;
  }
  return true;
}